

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O1

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall iDynTree::optimalcontrol::ConstraintsGroup::getTimeRanges(ConstraintsGroup *this)

{
  undefined8 *puVar1;
  ConstraintsGroupPimpl *pCVar2;
  _Hash_node_base *p_Var3;
  pointer pTVar4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  long lVar7;
  ulong __new_size;
  
  pCVar2 = this->m_pimpl;
  __new_size = (ulong)(uint)(pCVar2->group)._M_h._M_element_count;
  if (((long)(pCVar2->timeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pCVar2->timeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size != 0
     ) {
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(&pCVar2->timeRanges,__new_size);
  }
  p_Var6 = (this->m_pimpl->group)._M_h._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    lVar7 = 0;
    do {
      p_Var3 = p_Var6[5]._M_nxt;
      pTVar4 = (this->m_pimpl->timeRanges).
               super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (&pTVar4->m_anyTime)[lVar7] = *(bool *)&p_Var3[4]._M_nxt;
      p_Var5 = p_Var3[3]._M_nxt;
      puVar1 = (undefined8 *)((long)&pTVar4->m_initTime + lVar7);
      *puVar1 = p_Var3[2]._M_nxt;
      puVar1[1] = p_Var5;
      p_Var6 = p_Var6->_M_nxt;
      lVar7 = lVar7 + 0x18;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  return &this->m_pimpl->timeRanges;
}

Assistant:

std::vector<TimeRange>& ConstraintsGroup::getTimeRanges()
        {
            if (m_pimpl->timeRanges.size() != numberOfConstraints()) {
                m_pimpl->timeRanges.resize(numberOfConstraints());
            }

            size_t i=0;
            for (auto& constraint : m_pimpl->group) {
                m_pimpl->timeRanges[i] = constraint.second->timeRange;
                ++i;
            }
            return m_pimpl->timeRanges;
        }